

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

TextureFormatInfo *
tcu::getTextureFormatInfo(TextureFormatInfo *__return_storage_ptr__,TextureFormat *format)

{
  float fVar1;
  bool bVar2;
  deBool dVar3;
  deBool dVar4;
  deBool dVar5;
  deBool dVar6;
  float *pfVar7;
  Vec4 local_1fc;
  Vec4 local_1ec;
  Vec4 local_1dc;
  Vec4 local_1cc;
  float local_1bc;
  float local_1b8;
  float bias;
  float scale;
  BVec4 chnMask;
  Channel *map;
  Vec2 cRange;
  Vector<float,_4> local_190;
  Vector<float,_4> local_180;
  Vector<float,_4> local_170;
  Vector<float,_4> local_160;
  Vector<float,_4> local_150;
  Vector<float,_4> local_140;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  TextureFormat local_e0;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  TextureFormat *local_18;
  TextureFormat *format_local;
  
  local_18 = format;
  format_local = (TextureFormat *)__return_storage_ptr__;
  if (format->type == UNSIGNED_INT_1010102_REV) {
    Vector<float,_4>::Vector(&local_28,0.0,0.0,0.0,0.0);
    Vector<float,_4>::Vector(&local_38,1023.0,1023.0,1023.0,3.0);
    Vector<float,_4>::Vector(&local_48,0.0009775171,0.0009775171,0.0009775171,0.33333334);
    Vector<float,_4>::Vector(&local_58,0.0,0.0,0.0,0.0);
    TextureFormatInfo::TextureFormatInfo
              (__return_storage_ptr__,&local_28,&local_38,&local_48,&local_58);
  }
  else if (format->type == SIGNED_INT_1010102_REV) {
    Vector<float,_4>::Vector(&local_68,-512.0,-512.0,-512.0,-2.0);
    Vector<float,_4>::Vector(&local_78,511.0,511.0,511.0,1.0);
    Vector<float,_4>::Vector(&local_88,0.0009775171,0.0009775171,0.0009775171,0.33333334);
    Vector<float,_4>::Vector(&local_98,0.5,0.5,0.5,0.5);
    TextureFormatInfo::TextureFormatInfo
              (__return_storage_ptr__,&local_68,&local_78,&local_88,&local_98);
  }
  else if ((format->order == D) || (format->order == DS)) {
    Vector<float,_4>::Vector(&local_a8,0.0,0.0,0.0,0.0);
    Vector<float,_4>::Vector(&local_b8,1.0,1.0,1.0,0.0);
    Vector<float,_4>::Vector(&local_c8,1.0,1.0,1.0,1.0);
    Vector<float,_4>::Vector(&local_d8,0.0,0.0,0.0,0.0);
    TextureFormatInfo::TextureFormatInfo
              (__return_storage_ptr__,&local_a8,&local_b8,&local_c8,&local_d8);
  }
  else {
    TextureFormat::TextureFormat(&local_e0,RGBA,UNORM_SHORT_5551);
    bVar2 = TextureFormat::operator==(format,&local_e0);
    if (bVar2) {
      Vector<float,_4>::Vector(&local_f0,0.0,0.0,0.0,0.5);
      Vector<float,_4>::Vector(&local_100,1.0,1.0,1.0,1.5);
      Vector<float,_4>::Vector(&local_110,1.0,1.0,1.0,1.0);
      Vector<float,_4>::Vector(&local_120,0.0,0.0,0.0,0.0);
      TextureFormatInfo::TextureFormatInfo
                (__return_storage_ptr__,&local_f0,&local_100,&local_110,&local_120);
    }
    else if (local_18->type == UNSIGNED_SHORT_5551) {
      Vector<float,_4>::Vector(&local_130,0.0,0.0,0.0,0.0);
      Vector<float,_4>::Vector(&local_140,31.0,31.0,31.0,1.0);
      Vector<float,_4>::Vector(&local_150,0.032258064,0.032258064,0.032258064,1.0);
      Vector<float,_4>::Vector(&local_160,0.0,0.0,0.0,0.0);
      TextureFormatInfo::TextureFormatInfo
                (__return_storage_ptr__,&local_130,&local_140,&local_150,&local_160);
    }
    else if (local_18->type == UNSIGNED_SHORT_565) {
      Vector<float,_4>::Vector(&local_170,0.0,0.0,0.0,0.0);
      Vector<float,_4>::Vector(&local_180,31.0,63.0,31.0,0.0);
      Vector<float,_4>::Vector(&local_190,0.032258064,0.015873017,0.032258064,1.0);
      Vector<float,_4>::Vector((Vector<float,_4> *)&cRange,0.0,0.0,0.0,0.0);
      TextureFormatInfo::TextureFormatInfo
                (__return_storage_ptr__,&local_170,&local_180,&local_190,(Vec4 *)&cRange);
    }
    else {
      getFloatChannelValueRange((tcu *)&map,local_18->type);
      _scale = getChannelReadSwizzle(local_18->order);
      dVar3 = deInRange32(_scale->components[0],0,3);
      dVar4 = deInRange32(_scale->components[1],0,3);
      dVar5 = deInRange32(_scale->components[2],0,3);
      dVar6 = deInRange32(_scale->components[3],0,3);
      Vector<bool,_4>::Vector((Vector<bool,_4> *)&bias,dVar3 == 1,dVar4 == 1,dVar5 == 1,dVar6 == 1);
      pfVar7 = Vector<float,_2>::operator[]((Vector<float,_2> *)&map,1);
      fVar1 = *pfVar7;
      pfVar7 = Vector<float,_2>::operator[]((Vector<float,_2> *)&map,0);
      local_1b8 = 1.0 / (fVar1 - *pfVar7);
      pfVar7 = Vector<float,_2>::operator[]((Vector<float,_2> *)&map,0);
      local_1bc = -*pfVar7 * local_1b8;
      pfVar7 = Vector<float,_2>::operator[]((Vector<float,_2> *)&map,0);
      select<float,4>((tcu *)&local_1cc,*pfVar7,0.0,(Vector<bool,_4> *)&bias);
      pfVar7 = Vector<float,_2>::operator[]((Vector<float,_2> *)&map,1);
      select<float,4>((tcu *)&local_1dc,*pfVar7,0.0,(Vector<bool,_4> *)&bias);
      select<float,4>((tcu *)&local_1ec,local_1b8,1.0,(Vector<bool,_4> *)&bias);
      select<float,4>((tcu *)&local_1fc,local_1bc,0.0,(Vector<bool,_4> *)&bias);
      TextureFormatInfo::TextureFormatInfo
                (__return_storage_ptr__,&local_1cc,&local_1dc,&local_1ec,&local_1fc);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TextureFormatInfo getTextureFormatInfo (const TextureFormat& format)
{
	// Special cases.
	if (format.type == TextureFormat::UNSIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f),
								 Vec4(	  1023.0f,		 1023.0f,		 1023.0f,		 3.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f));
	if (format.type == TextureFormat::SIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	  -512.0f,		 -512.0f,		 -512.0f,		-2.0f),
								 Vec4(	   511.0f,		  511.0f,		  511.0f,		 1.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.5f,		    0.5f,		    0.5f,		 0.5f));
	else if (format.order == TextureFormat::D || format.order == TextureFormat::DS)
		return TextureFormatInfo(Vec4(0.0f,	0.0f,	0.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	1.0f),
								 Vec4(0.0f,	0.0f,	0.0f,	0.0f)); // Depth / stencil formats.
	else if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_SHORT_5551))
		return TextureFormatInfo(Vec4(0.0f, 0.0f, 0.0f, 0.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.0f),
								 Vec4(0.0f, 0.0f, 0.0f, 0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_5551)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 31.0f,		 31.0f,	1.0f),
								 Vec4(1.0f/31.f,	1.0f/31.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_565)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 63.0f,		 31.0f,	0.0f),
								 Vec4(1.0f/31.f,	1.0f/63.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));

	const Vec2						cRange		= getFloatChannelValueRange(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const float						scale		= 1.0f / (cRange[1] - cRange[0]);
	const float						bias		= -cRange[0] * scale;

	return TextureFormatInfo(select(cRange[0],	0.0f, chnMask),
							 select(cRange[1],	0.0f, chnMask),
							 select(scale,		1.0f, chnMask),
							 select(bias,		0.0f, chnMask));
}